

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor *
ggml_soft_max_ext_back_impl
          (ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,float scale,float max_bias,_Bool inplace)

{
  ggml_tensor *pgVar1;
  undefined3 in_register_00000009;
  
  if (CONCAT31(in_register_00000009,inplace) == 0) {
    pgVar1 = ggml_dup_tensor(ctx,a);
  }
  else {
    pgVar1 = ggml_view_tensor(ctx,a);
  }
  pgVar1->op = GGML_OP_SOFT_MAX_BACK;
  pgVar1->src[0] = a;
  pgVar1->src[1] = b;
  pgVar1->op_params[0] = (int32_t)scale;
  pgVar1->op_params[1] = (int32_t)max_bias;
  return pgVar1;
}

Assistant:

static struct ggml_tensor * ggml_soft_max_ext_back_impl(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b,
        float                 scale,
        float                 max_bias,
        bool                  inplace) {
    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    result->op     = GGML_OP_SOFT_MAX_BACK;
    result->src[0] = a;
    result->src[1] = b;

    memcpy((float *) result->op_params + 0, &scale,    sizeof(float));
    memcpy((float *) result->op_params + 1, &max_bias, sizeof(float));

    return result;
}